

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9ReadBlif(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  Gia_Man_t *pNew;
  char *pcVar3;
  uint fVerbose;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (argc - globalUtilOptind == 1) {
      pcVar3 = argv[globalUtilOptind];
      pcVar2 = pcVar3;
      do {
        if (*pcVar2 == '>') {
          *pcVar2 = '\\';
        }
        else if (*pcVar2 == '\0') {
          __stream = fopen(pcVar3,"r");
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
            pNew = Abc_NtkHieCecTest(pcVar3,fVerbose);
            Abc_FrameUpdateGia(pAbc,pNew);
            return 0;
          }
          Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar3);
          pcVar3 = Extra_FileGetSimilarName
                             (pcVar3,".blif",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
          if (pcVar3 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
          }
          Abc_Print(1,"\n");
          return 1;
        }
        pcVar2 = pcVar2 + 1;
      } while( true );
    }
    pcVar3 = "There is no file name.\n";
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: &read_blif [-vh] <file>\n");
    Abc_Print(-2,"\t         a specialized reader for hierarchical BLIF files\n");
    Abc_Print(-2,"\t         (for general-purpose BLIFs, please use \"read_blif\")\n");
    pcVar3 = "yes";
    if (fVerbose == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar3 = "\t<file> : the file name\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9ReadBlif( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Abc_NtkHieCecTest( char * pFileName, int fVerbose );
    Gia_Man_t * pAig;
    FILE * pFile;
    char ** pArgvNew;
    char * FileName, * pTemp;
    int nArgcNew;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".blif", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    pAig = Abc_NtkHieCecTest( FileName, fVerbose );
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &read_blif [-vh] <file>\n" );
    Abc_Print( -2, "\t         a specialized reader for hierarchical BLIF files\n" );
    Abc_Print( -2, "\t         (for general-purpose BLIFs, please use \"read_blif\")\n" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}